

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O2

int ecdsa_generate(ecdsa_key *ek,int bits)

{
  _Bool _Var1;
  mp_int *lo;
  mp_int *pmVar2;
  WeierstrassPoint *pWVar3;
  
  _Var1 = ec_nist_alg_and_curve_by_bits(bits,&ek->curve,&(ek->sshk).vt);
  if (_Var1) {
    lo = mp_from_integer(1);
    pmVar2 = mp_random_in_range_fn(lo,(ek->curve->field_6).w.G_order,random_read);
    ek->privateKey = pmVar2;
    mp_free(lo);
    pWVar3 = ecdsa_public(ek->privateKey,(ek->sshk).vt);
    ek->publicKey = pWVar3;
  }
  return (uint)_Var1;
}

Assistant:

int ecdsa_generate(struct ecdsa_key *ek, int bits)
{
    if (!ec_nist_alg_and_curve_by_bits(bits, &ek->curve, &ek->sshk.vt))
        return 0;

    mp_int *one = mp_from_integer(1);
    ek->privateKey = mp_random_in_range(one, ek->curve->w.G_order);
    mp_free(one);

    ek->publicKey = ecdsa_public(ek->privateKey, ek->sshk.vt);

    return 1;
}